

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O1

void evthread_debug_lock_mark_locked(uint mode,debug_lock *lock)

{
  int iVar1;
  long lVar2;
  unsigned_long uVar3;
  undefined4 in_register_0000003c;
  
  if (*(int *)CONCAT44(in_register_0000003c,mode) == -0x214f4ef4) {
    lVar2 = CONCAT44(in_register_0000003c,mode);
    iVar1 = *(int *)(CONCAT44(in_register_0000003c,mode) + 0x10);
    *(int *)(CONCAT44(in_register_0000003c,mode) + 0x10) = iVar1 + 1;
    if (iVar1 == 0 || (*(byte *)(CONCAT44(in_register_0000003c,mode) + 4) & 1) != 0) {
      if (evthread_id_fn_ == (_func_unsigned_long *)0x0) {
        return;
      }
      uVar3 = (*evthread_id_fn_)();
      if ((*(int *)(lVar2 + 0x10) < 2) || (*(unsigned_long *)(lVar2 + 8) == uVar3)) {
        *(unsigned_long *)(lVar2 + 8) = uVar3;
        return;
      }
      goto LAB_001f289e;
    }
  }
  else {
    evthread_debug_lock_mark_locked_cold_1();
  }
  evthread_debug_lock_mark_locked_cold_2();
LAB_001f289e:
  evthread_debug_lock_mark_locked_cold_3();
}

Assistant:

static void
evthread_debug_lock_mark_locked(unsigned mode, struct debug_lock *lock)
{
	EVUTIL_ASSERT(DEBUG_LOCK_SIG == lock->signature);
	++lock->count;
	if (!(lock->locktype & EVTHREAD_LOCKTYPE_RECURSIVE))
		EVUTIL_ASSERT(lock->count == 1);
	if (evthread_id_fn_) {
		unsigned long me;
		me = evthread_id_fn_();
		if (lock->count > 1)
			EVUTIL_ASSERT(lock->held_by == me);
		lock->held_by = me;
	}
}